

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  UpVal **ppUVar1;
  UpVal **ppUVar2;
  TValue *pTVar3;
  UpVal *uv;
  LClosure *f1;
  LClosure *pLStack_28;
  
  ppUVar1 = getupvalref(L,fidx1,n1,&pLStack_28);
  ppUVar2 = getupvalref(L,fidx2,n2,(LClosure **)0x0);
  luaC_upvdeccount(L,*ppUVar1);
  uv = *ppUVar2;
  *ppUVar1 = uv;
  uv->refcount = uv->refcount + 1;
  pTVar3 = uv->v;
  if (pTVar3 != (TValue *)&uv->u) {
    (uv->u).open.touched = 1;
    uv = *ppUVar1;
    pTVar3 = uv->v;
  }
  if (((pTVar3->tt_ & 0x40) != 0) && (pTVar3 == (TValue *)&uv->u)) {
    luaC_upvalbarrier_(L,uv);
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
  *up1 = *up2;
  luaC_objbarrier(L, f1, *up1);
}